

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

_Bool trans_FTMAD(DisasContext_conflict1 *s,arg_FTMAD *a)

{
  int iVar1;
  uint32_t oprsz;
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var2;
  TCGv_ptr ptr;
  uintptr_t o;
  
  iVar1 = a->esz;
  if (iVar1 != 0) {
    tcg_ctx = s->uc->tcg_ctx;
    _Var2 = sve_access_check_aarch64(s);
    if (_Var2) {
      oprsz = s->sve_len;
      ptr = get_fpstatus_ptr_aarch64(tcg_ctx,a->esz == 1);
      tcg_gen_gvec_3_ptr_aarch64
                (tcg_ctx,a->rd * 0x100 + 0xc10,a->rn * 0x100 + 0xc10,a->rm * 0x100 + 0xc10,ptr,oprsz
                 ,oprsz,a->imm,*(undefined1 **)(&DAT_01064268 + (long)a->esz * 8));
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ptr + (long)tcg_ctx));
    }
  }
  return iVar1 != 0;
}

Assistant:

static bool trans_FTMAD(DisasContext *s, arg_FTMAD *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    static gen_helper_gvec_3_ptr * const fns[3] = {
        gen_helper_sve_ftmad_h,
        gen_helper_sve_ftmad_s,
        gen_helper_sve_ftmad_d,
    };

    if (a->esz == 0) {
        return false;
    }
    if (sve_access_check(s)) {
        unsigned vsz = vec_full_reg_size(s);
        TCGv_ptr status = get_fpstatus_ptr(tcg_ctx, a->esz == MO_16);
        tcg_gen_gvec_3_ptr(tcg_ctx, vec_full_reg_offset(s, a->rd),
                           vec_full_reg_offset(s, a->rn),
                           vec_full_reg_offset(s, a->rm),
                           status, vsz, vsz, a->imm, fns[a->esz - 1]);
        tcg_temp_free_ptr(tcg_ctx, status);
    }
    return true;
}